

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O1

float __thiscall nv::FloatImage::sampleNearestClamp(FloatImage *this,float x,float y,int c)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  uVar1 = this->m_width;
  iVar3 = (int)((float)uVar1 * x);
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  if ((int)(uVar1 - 1) < iVar3) {
    iVar3 = uVar1 - 1;
  }
  uVar2 = this->m_height;
  iVar5 = (int)((float)uVar2 * y);
  iVar4 = 0;
  if (0 < iVar5) {
    iVar4 = iVar5;
  }
  if ((int)(uVar2 - 1) < iVar4) {
    iVar4 = uVar2 - 1;
  }
  return this->m_mem[(c * (uint)uVar2 + iVar4) * (uint)uVar1 + iVar3];
}

Assistant:

float FloatImage::sampleNearestClamp(const float x, const float y, const int c) const
{
	int ix = ::clamp(iround(x * m_width), 0, m_width-1);
	int iy = ::clamp(iround(y * m_height), 0, m_height-1);
	return pixel(ix, iy, c);
}